

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLSLMaterialRenderer.cpp
# Opt level: O1

bool __thiscall irr::video::COpenGLSLMaterialRenderer::linkProgram(COpenGLSLMaterialRenderer *this)

{
  GLuint GVar1;
  int iVar2;
  char *pcVar3;
  Printer *this_00;
  code *pcVar4;
  undefined1 uVar5;
  undefined8 unaff_RBP;
  undefined7 uVar7;
  undefined8 uVar6;
  long lVar8;
  int iVar9;
  char cVar10;
  undefined8 unaff_R14;
  undefined7 uVar12;
  undefined8 uVar11;
  ulong uVar13;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar14;
  undefined4 in_XMM0_Db;
  double dVar15;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar16;
  GLint num;
  GLint maxlen;
  GLint status;
  GLint maxLength;
  GLint size;
  u32 local_7c;
  int local_78;
  int local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined1 local_68 [32];
  undefined1 local_48 [4];
  GLint local_44;
  array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *local_40;
  undefined1 local_34 [4];
  
  dVar15 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  lVar8 = *(long *)&(this->super_IMaterialRenderer).field_0x10;
  uVar7 = (undefined7)((ulong)unaff_RBP >> 8);
  uVar12 = (undefined7)((ulong)unaff_R14 >> 8);
  if (this->Program2 == 0) {
    pcVar4 = *(code **)(lVar8 + 0x750);
    if (pcVar4 != (code *)0x0) {
      dVar15 = (double)(*pcVar4)(this->Program);
    }
    local_74 = 0;
    pcVar4 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7d8);
    if (pcVar4 != (code *)0x0) {
      dVar15 = (double)(*pcVar4)(this->Program,0x8b82,&local_74);
    }
    if (local_74 == 0) {
      dVar15 = os::Printer::log((Printer *)"GLSL shader program failed to link",dVar15);
      local_68._0_8_ = (ulong)(uint)local_68._4_4_ << 0x20;
      pcVar4 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7d8);
      if (pcVar4 != (code *)0x0) {
        (*pcVar4)(SUB84(dVar15,0),this->Program,0x8b84,local_68);
      }
      uVar13 = (ulong)(int)local_68._0_4_;
      if (uVar13 != 0) {
        this_00 = (Printer *)operator_new__(uVar13);
        GVar1 = this->Program;
        pcVar4 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7c0);
        uVar14 = extraout_XMM0_Da_00;
        uVar16 = extraout_XMM0_Db_00;
        goto LAB_001ede28;
      }
      goto LAB_001ede4f;
    }
    local_7c = 0;
    pcVar4 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7d8);
    if (pcVar4 != (code *)0x0) {
      dVar15 = (double)(*pcVar4)(this->Program,0x8b86,&local_7c);
    }
    uVar6 = CONCAT71(uVar7,local_7c == 0);
    if (local_7c == 0) goto LAB_001eddbd;
    local_78 = 0;
    pcVar4 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7d8);
    if (pcVar4 != (code *)0x0) {
      dVar15 = (double)(*pcVar4)(this->Program,0x8b87,&local_78);
    }
    lVar8 = (long)local_78;
    uVar11 = CONCAT71(uVar12,lVar8 != 0);
    if (lVar8 == 0) {
      pcVar3 = "GLSL: failed to retrieve uniform information";
      goto LAB_001ede66;
    }
    local_70 = (undefined4)uVar11;
    local_6c = (undefined4)uVar6;
    local_78 = (int)(lVar8 + 1U);
    pcVar3 = (char *)operator_new__(lVar8 + 1U);
    iVar9 = 0;
    local_68._0_8_ =
         (this->UniformInfo).m_data.
         super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_68._8_8_ =
         (this->UniformInfo).m_data.
         super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_68._16_8_ =
         (this->UniformInfo).m_data.
         super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->UniformInfo).m_data.
    super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->UniformInfo).m_data.
    super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->UniformInfo).m_data.
    super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
    ::~vector((vector<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
               *)local_68);
    (this->UniformInfo).is_sorted = true;
    local_40 = &this->UniformInfo;
    core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::reallocate
              (&this->UniformInfo,local_7c,true);
    if (0 < (int)local_7c) {
      do {
        iVar2 = local_78;
        local_68._8_8_ = (pointer)0x0;
        local_68._16_8_ = local_68._16_8_ & 0xffffffffffffff00;
        local_68._0_8_ = (pointer)(local_68 + 0x10);
        memset(pcVar3,0,(long)local_78);
        pcVar4 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x8a8);
        if (pcVar4 != (code *)0x0) {
          (*pcVar4)(this->Program,iVar9,iVar2,0,local_34,local_48,pcVar3);
        }
        core::string<char>::operator=((string<char> *)local_68,pcVar3);
        pcVar4 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7f0);
        if (pcVar4 == (code *)0x0) {
          local_44 = 0;
        }
        else {
          local_44 = (*pcVar4)(this->Program,pcVar3);
        }
        ::std::
        vector<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
        ::push_back(&local_40->m_data,(value_type *)local_68);
        (this->UniformInfo).is_sorted = false;
        if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
          operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < (int)local_7c);
    }
  }
  else {
    pcVar4 = *(code **)(lVar8 + 0x7b8);
    if (pcVar4 != (code *)0x0) {
      dVar15 = (double)(*pcVar4)();
    }
    local_74 = 0;
    pcVar4 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7e8);
    if (pcVar4 != (code *)0x0) {
      dVar15 = (double)(*pcVar4)(this->Program2,0x8b82,&local_74);
    }
    if (local_74 == 0) {
      dVar15 = os::Printer::log((Printer *)"GLSL (> 2.x) shader program failed to link",dVar15);
      local_68._0_8_ = (ulong)(uint)local_68._4_4_ << 0x20;
      pcVar4 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7e8);
      if (pcVar4 != (code *)0x0) {
        (*pcVar4)(SUB84(dVar15,0),this->Program2,0x8b84,local_68);
      }
      uVar13 = (ulong)(int)local_68._0_4_;
      if (uVar13 != 0) {
        this_00 = (Printer *)operator_new__(uVar13);
        GVar1 = this->Program2;
        pcVar4 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 2000);
        uVar14 = extraout_XMM0_Da;
        uVar16 = extraout_XMM0_Db;
LAB_001ede28:
        dVar15 = (double)CONCAT44(uVar16,uVar14);
        local_7c = 0;
        if (pcVar4 != (code *)0x0) {
          dVar15 = (double)(*pcVar4)(GVar1,uVar13 & 0xffffffff,&local_7c,this_00);
        }
        os::Printer::log(this_00,dVar15);
        operator_delete__(this_00);
      }
LAB_001ede4f:
      cVar10 = '\0';
      uVar5 = 0;
      goto LAB_001ede70;
    }
    local_7c = 0;
    pcVar4 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7e8);
    if (pcVar4 != (code *)0x0) {
      dVar15 = (double)(*pcVar4)(this->Program2,0x8b86,&local_7c);
    }
    uVar6 = CONCAT71(uVar7,local_7c == 0);
    if (local_7c == 0) {
LAB_001eddbd:
      uVar5 = (undefined1)uVar6;
      cVar10 = '\0';
      goto LAB_001ede70;
    }
    local_78 = 0;
    pcVar4 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7e8);
    if (pcVar4 != (code *)0x0) {
      dVar15 = (double)(*pcVar4)(this->Program2,0x8b87,&local_78);
    }
    lVar8 = (long)local_78;
    uVar11 = CONCAT71(uVar12,lVar8 != 0);
    if (lVar8 == 0) {
      pcVar3 = "GLSL (> 2.x): failed to retrieve uniform information";
LAB_001ede66:
      uVar5 = (undefined1)uVar6;
      cVar10 = (char)uVar11;
      os::Printer::log((Printer *)pcVar3,dVar15);
      goto LAB_001ede70;
    }
    local_70 = (undefined4)uVar11;
    local_6c = (undefined4)uVar6;
    local_78 = (int)(lVar8 + 1U);
    pcVar3 = (char *)operator_new__(lVar8 + 1U);
    iVar9 = 0;
    local_68._0_8_ =
         (this->UniformInfo).m_data.
         super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_68._8_8_ =
         (this->UniformInfo).m_data.
         super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_68._16_8_ =
         (this->UniformInfo).m_data.
         super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->UniformInfo).m_data.
    super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->UniformInfo).m_data.
    super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->UniformInfo).m_data.
    super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
    ::~vector((vector<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
               *)local_68);
    (this->UniformInfo).is_sorted = true;
    local_40 = &this->UniformInfo;
    core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::reallocate
              (&this->UniformInfo,local_7c,true);
    if (0 < (int)local_7c) {
      do {
        iVar2 = local_78;
        local_68._8_8_ = (pointer)0x0;
        local_68._16_8_ = local_68._16_8_ & 0xffffffffffffff00;
        local_68._0_8_ = (pointer)(local_68 + 0x10);
        memset(pcVar3,0,(long)local_78);
        pcVar4 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x8b0);
        if (pcVar4 != (code *)0x0) {
          (*pcVar4)(this->Program2,iVar9,iVar2,0,local_34,local_48,pcVar3);
        }
        core::string<char>::operator=((string<char> *)local_68,pcVar3);
        pcVar4 = *(code **)(*(long *)&(this->super_IMaterialRenderer).field_0x10 + 0x7f8);
        if (pcVar4 == (code *)0x0) {
          local_44 = 0;
        }
        else {
          local_44 = (*pcVar4)(this->Program2,pcVar3);
        }
        ::std::
        vector<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
        ::push_back(&local_40->m_data,(value_type *)local_68);
        (this->UniformInfo).is_sorted = false;
        if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
          operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 < (int)local_7c);
    }
  }
  operator_delete__(pcVar3);
  uVar5 = (undefined1)local_6c;
  cVar10 = (char)local_70;
LAB_001ede70:
  if (cVar10 != '\0') {
    uVar5 = 1;
  }
  return (bool)uVar5;
}

Assistant:

bool COpenGLSLMaterialRenderer::linkProgram()
{
	if (Program2) {
		Driver->extGlLinkProgram(Program2);

		GLint status = 0;

#ifdef GL_VERSION_2_0
		Driver->extGlGetProgramiv(Program2, GL_LINK_STATUS, &status);
#endif

		if (!status) {
			os::Printer::log("GLSL (> 2.x) shader program failed to link", ELL_ERROR);
			// check error message and log it
			GLint maxLength = 0;
			GLsizei length;
#ifdef GL_VERSION_2_0
			Driver->extGlGetProgramiv(Program2, GL_INFO_LOG_LENGTH, &maxLength);
#endif
			if (maxLength) {
				GLchar *infoLog = new GLchar[maxLength];
				Driver->extGlGetProgramInfoLog(Program2, maxLength, &length, infoLog);
				os::Printer::log(reinterpret_cast<const c8 *>(infoLog), ELL_ERROR);
				delete[] infoLog;
			}

			return false;
		}

		// get uniforms information

		GLint num = 0;
#ifdef GL_VERSION_2_0
		Driver->extGlGetProgramiv(Program2, GL_ACTIVE_UNIFORMS, &num);
#endif

		if (num == 0) {
			// no uniforms
			return true;
		}

		GLint maxlen = 0;
#ifdef GL_VERSION_2_0
		Driver->extGlGetProgramiv(Program2, GL_ACTIVE_UNIFORM_MAX_LENGTH, &maxlen);
#endif

		if (maxlen == 0) {
			os::Printer::log("GLSL (> 2.x): failed to retrieve uniform information", ELL_ERROR);
			return false;
		}

		// seems that some implementations use an extra null terminator
		++maxlen;
		c8 *buf = new c8[maxlen];

		UniformInfo.clear();
		UniformInfo.reallocate(num);

		for (GLint i = 0; i < num; ++i) {
			SUniformInfo ui;
			memset(buf, 0, maxlen);

			GLint size;
			Driver->extGlGetActiveUniform(Program2, i, maxlen, 0, &size, &ui.type, reinterpret_cast<GLchar *>(buf));
			ui.name = buf;
			ui.location = Driver->extGlGetUniformLocation(Program2, buf);

			UniformInfo.push_back(ui);
		}

		delete[] buf;
	} else {
		Driver->extGlLinkProgramARB(Program);

		GLint status = 0;

#ifdef GL_ARB_shader_objects
		Driver->extGlGetObjectParameteriv(Program, GL_OBJECT_LINK_STATUS_ARB, &status);
#endif

		if (!status) {
			os::Printer::log("GLSL shader program failed to link", ELL_ERROR);
			// check error message and log it
			GLint maxLength = 0;
			GLsizei length;
#ifdef GL_ARB_shader_objects
			Driver->extGlGetObjectParameteriv(Program,
					GL_OBJECT_INFO_LOG_LENGTH_ARB, &maxLength);
#endif
			if (maxLength) {
				GLcharARB *infoLog = new GLcharARB[maxLength];
				Driver->extGlGetInfoLog(Program, maxLength, &length, infoLog);
				os::Printer::log(reinterpret_cast<const c8 *>(infoLog), ELL_ERROR);
				delete[] infoLog;
			}

			return false;
		}

		// get uniforms information

		GLint num = 0;
#ifdef GL_ARB_shader_objects
		Driver->extGlGetObjectParameteriv(Program, GL_OBJECT_ACTIVE_UNIFORMS_ARB, &num);
#endif

		if (num == 0) {
			// no uniforms
			return true;
		}

		GLint maxlen = 0;
#ifdef GL_ARB_shader_objects
		Driver->extGlGetObjectParameteriv(Program, GL_OBJECT_ACTIVE_UNIFORM_MAX_LENGTH_ARB, &maxlen);
#endif

		if (maxlen == 0) {
			os::Printer::log("GLSL: failed to retrieve uniform information", ELL_ERROR);
			return false;
		}

		// seems that some implementations use an extra null terminator
		++maxlen;
		c8 *buf = new c8[maxlen];

		UniformInfo.clear();
		UniformInfo.reallocate(num);

		for (int i = 0; i < num; ++i) {
			SUniformInfo ui;
			memset(buf, 0, maxlen);

			GLint size;
			Driver->extGlGetActiveUniformARB(Program, i, maxlen, 0, &size, &ui.type, reinterpret_cast<GLcharARB *>(buf));
			ui.name = buf;
			ui.location = Driver->extGlGetUniformLocationARB(Program, buf);

			UniformInfo.push_back(ui);
		}

		delete[] buf;
	}

	return true;
}